

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O0

void af_latin_sort_blue(FT_UInt count,AF_LatinBlue *table)

{
  AF_LatinBlue pAVar1;
  long local_38;
  FT_Pos b;
  FT_Pos a;
  AF_LatinBlue swap;
  FT_UInt j;
  FT_UInt i;
  AF_LatinBlue *table_local;
  FT_UInt count_local;
  
  swap._4_4_ = 1;
  do {
    if (count <= swap._4_4_) {
      return;
    }
    for (swap._0_4_ = swap._4_4_; (uint)swap != 0; swap._0_4_ = (uint)swap - 1) {
      if ((table[(uint)swap - 1]->flags & 6) == 0) {
        b = (table[(uint)swap - 1]->shoot).org;
      }
      else {
        b = (table[(uint)swap - 1]->ref).org;
      }
      if ((table[(uint)swap]->flags & 6) == 0) {
        local_38 = (table[(uint)swap]->shoot).org;
      }
      else {
        local_38 = (table[(uint)swap]->ref).org;
      }
      if (b <= local_38) break;
      pAVar1 = table[(uint)swap];
      table[(uint)swap] = table[(uint)swap - 1];
      table[(uint)swap - 1] = pAVar1;
    }
    swap._4_4_ = swap._4_4_ + 1;
  } while( true );
}

Assistant:

static void
  af_latin_sort_blue( FT_UInt        count,
                      AF_LatinBlue*  table )
  {
    FT_UInt       i, j;
    AF_LatinBlue  swap;


    /* we sort from bottom to top */
    for ( i = 1; i < count; i++ )
    {
      for ( j = i; j > 0; j-- )
      {
        FT_Pos  a, b;


        if ( table[j - 1]->flags & ( AF_LATIN_BLUE_TOP     |
                                     AF_LATIN_BLUE_SUB_TOP ) )
          a = table[j - 1]->ref.org;
        else
          a = table[j - 1]->shoot.org;

        if ( table[j]->flags & ( AF_LATIN_BLUE_TOP     |
                                 AF_LATIN_BLUE_SUB_TOP ) )
          b = table[j]->ref.org;
        else
          b = table[j]->shoot.org;

        if ( b >= a )
          break;

        swap         = table[j];
        table[j]     = table[j - 1];
        table[j - 1] = swap;
      }
    }
  }